

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::avx::InstanceIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  Instance *pIVar3;
  AffineSpace3ff *pAVar4;
  RTCPointQueryContext *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 uVar9;
  uint uVar10;
  bool bVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar20;
  float fVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar22;
  float fVar23;
  float fVar25;
  float fVar26;
  undefined1 auVar24 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined8 local_138;
  undefined4 local_130;
  float local_12c;
  float local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 local_90;
  PointQuery *local_88;
  int local_80;
  undefined1 local_78 [16];
  float local_68;
  void *local_60;
  undefined8 local_58;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  pIVar3 = prim->instance;
  pAVar4 = pIVar3->local2world;
  if ((pIVar3->super_Geometry).field_8.field_0x1 == '\x01') {
    fVar42 = (pAVar4->p).field_0.m128[3];
    fVar43 = (pAVar4->l).vx.field_0.m128[3];
    fVar44 = (pAVar4->l).vy.field_0.m128[3];
    fVar30 = (pAVar4->l).vz.field_0.m128[3];
    fVar31 = fVar43 * fVar44 + fVar42 * fVar30;
    fVar34 = fVar43 * fVar44 - fVar42 * fVar30;
    fVar35 = fVar42 * fVar42 - fVar43 * fVar43;
    fVar36 = fVar43 * fVar30 - fVar42 * fVar44;
    fVar32 = fVar43 * fVar30 + fVar42 * fVar44;
    fVar33 = fVar44 * fVar30 + fVar42 * fVar43;
    fVar37 = fVar44 * fVar30 - fVar42 * fVar43;
    auVar29 = ZEXT416((uint)(-fVar30 * fVar30 + -fVar44 * fVar44 + fVar42 * fVar42 + fVar43 * fVar43
                            ));
    auVar29 = vshufps_avx(auVar29,auVar29,0);
    auVar28 = ZEXT416((uint)(fVar31 + fVar31));
    auVar28 = vshufps_avx(auVar28,auVar28,0);
    auVar19 = ZEXT416((uint)(fVar36 + fVar36));
    auVar19 = vshufps_avx(auVar19,auVar19,0);
    fVar13 = auVar29._0_4_ * 1.0 + auVar19._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
    fVar14 = auVar29._4_4_ * 0.0 + auVar19._4_4_ * 0.0 + auVar28._4_4_ * 1.0;
    fVar15 = auVar29._8_4_ * 0.0 + auVar19._8_4_ * 1.0 + auVar28._8_4_ * 0.0;
    fVar16 = auVar29._12_4_ * 0.0 + auVar19._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
    auVar29 = ZEXT416((uint)(-fVar30 * fVar30 + fVar44 * fVar44 + fVar35));
    auVar29 = vshufps_avx(auVar29,auVar29,0);
    auVar28 = ZEXT416((uint)(fVar33 + fVar33));
    auVar28 = vshufps_avx(auVar28,auVar28,0);
    auVar19 = ZEXT416((uint)(fVar34 + fVar34));
    auVar19 = vshufps_avx(auVar19,auVar19,0);
    fVar17 = auVar19._0_4_ * 1.0 + auVar29._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
    fVar20 = auVar19._4_4_ * 0.0 + auVar29._4_4_ * 1.0 + auVar28._4_4_ * 0.0;
    fVar21 = auVar19._8_4_ * 0.0 + auVar29._8_4_ * 0.0 + auVar28._8_4_ * 1.0;
    fVar22 = auVar19._12_4_ * 0.0 + auVar29._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
    auVar29 = ZEXT416((uint)(fVar30 * fVar30 + -fVar44 * fVar44 + fVar35));
    auVar28 = vshufps_avx(auVar29,auVar29,0);
    auVar29 = vshufps_avx((undefined1  [16])(pAVar4->l).vx.field_0,ZEXT416(0) << 0x20,0xe9);
    auVar29 = vblendps_avx(auVar29,(undefined1  [16])(pAVar4->l).vy.field_0,4);
    auVar19 = ZEXT416((uint)(fVar37 + fVar37));
    auVar19 = vshufps_avx(auVar19,auVar19,0);
    auVar18 = ZEXT416((uint)(fVar32 + fVar32));
    auVar18 = vshufps_avx(auVar18,auVar18,0);
    fVar23 = auVar18._0_4_ * 1.0 + auVar19._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
    fVar25 = auVar18._4_4_ * 0.0 + auVar19._4_4_ * 1.0 + auVar28._4_4_ * 0.0;
    fVar26 = auVar18._8_4_ * 0.0 + auVar19._8_4_ * 0.0 + auVar28._8_4_ * 1.0;
    fVar27 = auVar18._12_4_ * 0.0 + auVar19._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
    fVar42 = (pAVar4->l).vx.field_0.m128[0];
    fVar34 = fVar42 * fVar13 + fVar17 * 0.0 + fVar23 * 0.0;
    fVar35 = fVar42 * fVar14 + fVar20 * 0.0 + fVar25 * 0.0;
    fVar36 = fVar42 * fVar15 + fVar21 * 0.0 + fVar26 * 0.0;
    fVar37 = fVar42 * fVar16 + fVar22 * 0.0 + fVar27 * 0.0;
    fVar42 = (pAVar4->l).vy.field_0.m128[0];
    fVar43 = (pAVar4->l).vy.field_0.m128[1];
    fVar30 = fVar42 * fVar13 + fVar43 * fVar17 + fVar23 * 0.0;
    fVar31 = fVar42 * fVar14 + fVar43 * fVar20 + fVar25 * 0.0;
    fVar32 = fVar42 * fVar15 + fVar43 * fVar21 + fVar26 * 0.0;
    fVar33 = fVar42 * fVar16 + fVar43 * fVar22 + fVar27 * 0.0;
    fVar42 = (pAVar4->l).vz.field_0.m128[1];
    fVar43 = (pAVar4->l).vz.field_0.m128[2];
    fVar44 = (pAVar4->l).vz.field_0.m128[0];
    fVar38 = fVar44 * fVar13 + fVar42 * fVar17 + fVar43 * fVar23;
    fVar39 = fVar44 * fVar14 + fVar42 * fVar20 + fVar43 * fVar25;
    fVar40 = fVar44 * fVar15 + fVar42 * fVar21 + fVar43 * fVar26;
    fVar41 = fVar44 * fVar16 + fVar42 * fVar22 + fVar43 * fVar27;
    fVar42 = (pAVar4->p).field_0.m128[2];
    fVar43 = (pAVar4->p).field_0.m128[1];
    fVar44 = (pAVar4->p).field_0.m128[0];
    fVar13 = auVar29._0_4_ + 0.0 + fVar44 * fVar13 + fVar43 * fVar17 + fVar42 * fVar23;
    fVar14 = auVar29._4_4_ + 0.0 + fVar44 * fVar14 + fVar43 * fVar20 + fVar42 * fVar25;
    fVar15 = auVar29._8_4_ + 0.0 + fVar44 * fVar15 + fVar43 * fVar21 + fVar42 * fVar26;
    fVar42 = auVar29._12_4_ + 0.0 + fVar44 * fVar16 + fVar43 * fVar22 + fVar42 * fVar27;
  }
  else {
    fVar34 = (pAVar4->l).vx.field_0.m128[0];
    fVar35 = (pAVar4->l).vx.field_0.m128[1];
    fVar36 = (pAVar4->l).vx.field_0.m128[2];
    fVar37 = (pAVar4->l).vx.field_0.m128[3];
    fVar30 = (pAVar4->l).vy.field_0.m128[0];
    fVar31 = (pAVar4->l).vy.field_0.m128[1];
    fVar32 = (pAVar4->l).vy.field_0.m128[2];
    fVar33 = (pAVar4->l).vy.field_0.m128[3];
    fVar38 = (pAVar4->l).vz.field_0.m128[0];
    fVar39 = (pAVar4->l).vz.field_0.m128[1];
    fVar40 = (pAVar4->l).vz.field_0.m128[2];
    fVar41 = (pAVar4->l).vz.field_0.m128[3];
    fVar13 = (pAVar4->p).field_0.m128[0];
    fVar14 = (pAVar4->p).field_0.m128[1];
    fVar15 = (pAVar4->p).field_0.m128[2];
    fVar42 = (pAVar4->p).field_0.m128[3];
  }
  auVar29 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vx.field_0.m128;
  auVar28 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vy.field_0.m128;
  auVar19 = *(undefined1 (*) [16])(pIVar3->world2local0).l.vz.field_0.m128;
  fVar43 = (pIVar3->world2local0).p.field_0.m128[0];
  fVar44 = (pIVar3->world2local0).p.field_0.m128[1];
  fVar16 = (pIVar3->world2local0).p.field_0.m128[2];
  fVar17 = (pIVar3->world2local0).p.field_0.m128[3];
  if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
    local_80 = 2;
    local_68 = 0.0;
    goto LAB_015fc2e4;
  }
  auVar18 = vdpps_avx(auVar29,auVar28,0x7f);
  auVar24._8_4_ = 0x7fffffff;
  auVar24._0_8_ = 0x7fffffff7fffffff;
  auVar24._12_4_ = 0x7fffffff;
  auVar18 = vandps_avx(auVar18,auVar24);
  local_68 = 0.0;
  if (1e-05 < auVar18._0_4_) {
LAB_015fc2cc:
    bVar11 = false;
  }
  else {
    auVar18 = vdpps_avx(auVar29,auVar19,0x7f);
    auVar18 = vandps_avx(auVar18,auVar24);
    if (1e-05 < auVar18._0_4_) goto LAB_015fc2cc;
    auVar18 = vdpps_avx(auVar28,auVar19,0x7f);
    auVar18 = vandps_avx(auVar18,auVar24);
    if (1e-05 < auVar18._0_4_) goto LAB_015fc2cc;
    auVar6 = vdpps_avx(auVar29,auVar29,0x7f);
    auVar7 = vdpps_avx(auVar28,auVar28,0x7f);
    fVar20 = auVar6._0_4_;
    auVar18 = vandps_avx(ZEXT416((uint)(fVar20 - auVar7._0_4_)),auVar24);
    bVar11 = false;
    if (auVar18._0_4_ <= 1e-05) {
      auVar8 = vdpps_avx(auVar19,auVar19,0x7f);
      auVar18 = vandps_avx(ZEXT416((uint)(fVar20 - auVar8._0_4_)),auVar24);
      bVar11 = false;
      if (auVar18._0_4_ <= 1e-05) {
        auVar18 = vandps_avx(ZEXT416((uint)(auVar7._0_4_ - auVar8._0_4_)),auVar24);
        bVar11 = auVar18._0_4_ <= 1e-05;
        if (auVar18._0_4_ <= 1e-05) {
          bVar11 = true;
          if (fVar20 < 0.0) {
            local_118 = fVar43;
            fStack_114 = fVar44;
            fStack_110 = fVar16;
            fStack_10c = fVar17;
            local_108 = auVar19;
            local_f8 = auVar28;
            local_e8 = auVar29;
            local_d8 = fVar13;
            fStack_d4 = fVar14;
            fStack_d0 = fVar15;
            fStack_cc = fVar42;
            local_c8 = fVar38;
            fStack_c4 = fVar39;
            fStack_c0 = fVar40;
            fStack_bc = fVar41;
            local_b8 = fVar30;
            fStack_b4 = fVar31;
            fStack_b0 = fVar32;
            fStack_ac = fVar33;
            local_a8 = fVar34;
            fStack_a4 = fVar35;
            fStack_a0 = fVar36;
            fStack_9c = fVar37;
            local_68 = sqrtf(fVar20);
            auVar29 = local_e8;
            auVar28 = local_f8;
            auVar19 = local_108;
            fVar30 = local_b8;
            fVar31 = fStack_b4;
            fVar32 = fStack_b0;
            fVar33 = fStack_ac;
            fVar34 = local_a8;
            fVar35 = fStack_a4;
            fVar36 = fStack_a0;
            fVar37 = fStack_9c;
            fVar38 = local_c8;
            fVar39 = fStack_c4;
            fVar40 = fStack_c0;
            fVar41 = fStack_bc;
            fVar13 = local_d8;
            fVar14 = fStack_d4;
            fVar15 = fStack_d0;
            fVar42 = fStack_cc;
            fVar43 = local_118;
            fVar44 = fStack_114;
            fVar16 = fStack_110;
            fVar17 = fStack_10c;
          }
          else {
            auVar18 = vsqrtss_avx(auVar6,auVar6);
            local_68 = auVar18._0_4_;
          }
        }
      }
    }
  }
  local_80 = 2 - (uint)bVar11;
LAB_015fc2e4:
  pRVar5 = context->userContext;
  uVar10 = pRVar5->instStackSize;
  pRVar5->instID[uVar10] = prim->instID_;
  pRVar5->instPrimID[uVar10] = 0;
  *(undefined1 (*) [16])pRVar5->world2inst[uVar10] = auVar29;
  *(undefined1 (*) [16])(pRVar5->world2inst[uVar10] + 4) = auVar28;
  *(undefined1 (*) [16])(pRVar5->world2inst[uVar10] + 8) = auVar19;
  pfVar1 = pRVar5->world2inst[uVar10] + 0xc;
  *pfVar1 = fVar43;
  pfVar1[1] = fVar44;
  pfVar1[2] = fVar16;
  pfVar1[3] = fVar17;
  pafVar2 = pRVar5->inst2world + uVar10;
  (*pafVar2)[0] = fVar34;
  (*pafVar2)[1] = fVar35;
  (*pafVar2)[2] = fVar36;
  (*pafVar2)[3] = fVar37;
  pfVar1 = pRVar5->inst2world[uVar10] + 4;
  *pfVar1 = fVar30;
  pfVar1[1] = fVar31;
  pfVar1[2] = fVar32;
  pfVar1[3] = fVar33;
  pfVar1 = pRVar5->inst2world[uVar10] + 8;
  *pfVar1 = fVar38;
  pfVar1[1] = fVar39;
  pfVar1[2] = fVar40;
  pfVar1[3] = fVar41;
  pfVar1 = pRVar5->inst2world[uVar10] + 0xc;
  *pfVar1 = fVar13;
  pfVar1[1] = fVar14;
  pfVar1[2] = fVar15;
  pfVar1[3] = fVar42;
  pRVar5->instStackSize = pRVar5->instStackSize + 1;
  local_12c = query->time;
  fVar42 = (query->p).field_0.field_0.x;
  fVar30 = (query->p).field_0.field_0.y;
  fVar31 = (query->p).field_0.field_0.z;
  auVar18._0_4_ = auVar29._0_4_ * fVar42 + auVar28._0_4_ * fVar30 + fVar43 + auVar19._0_4_ * fVar31;
  auVar18._4_4_ = auVar29._4_4_ * fVar42 + auVar28._4_4_ * fVar30 + fVar44 + auVar19._4_4_ * fVar31;
  auVar18._8_4_ = auVar29._8_4_ * fVar42 + auVar28._8_4_ * fVar30 + fVar16 + auVar19._8_4_ * fVar31;
  auVar18._12_4_ =
       auVar29._12_4_ * fVar42 + auVar28._12_4_ * fVar30 + fVar17 + auVar19._12_4_ * fVar31;
  local_138 = vmovlps_avx(auVar18);
  local_130 = vextractps_avx(auVar18,2);
  local_128 = local_68 * query->radius;
  local_98 = *(undefined8 *)&(pIVar3->super_Geometry).field_0x58;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78._0_8_ = context->func;
  local_78._8_8_ = context->userContext;
  local_58 = 0xffffffffffffffff;
  local_48._4_4_ = local_88->radius;
  local_48._0_4_ = local_48._4_4_;
  fStack_40 = (float)local_48._4_4_;
  fStack_3c = (float)local_48._4_4_;
  fVar42 = local_88->radius;
  if (local_80 == 2) {
    if ((INFINITY <= fVar42) || (lVar12 = vpextrq_avx(local_78,1), *(int *)(lVar12 + 0x88) == 0)) {
      local_38 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
    }
    else {
      pointQuery();
    }
  }
  else {
    local_38 = vshufps_avx(ZEXT416((uint)(local_68 * fVar42)),ZEXT416((uint)(local_68 * fVar42)),0);
  }
  lVar12 = *(long *)&(pIVar3->super_Geometry).field_0x58;
  _local_48 = local_38;
  uVar9 = (**(code **)(lVar12 + 0x88))(lVar12 + 0x58,&local_138);
  pRVar5 = context->userContext;
  uVar10 = pRVar5->instStackSize - 1;
  pRVar5->instStackSize = uVar10;
  pRVar5->instID[uVar10] = 0xffffffff;
  pRVar5->instPrimID[pRVar5->instStackSize] = 0xffffffff;
  return (bool)uVar9;
}

Assistant:

bool InstanceIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World();
      const AffineSpace3fa world2local = instance->getWorld2Local();
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }